

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathShear.h
# Opt level: O0

Shear6<float> * __thiscall Imath_2_5::Shear6<float>::operator*=(Shear6<float> *this,float a)

{
  float a_local;
  Shear6<float> *this_local;
  
  this->xy = a * this->xy;
  this->xz = a * this->xz;
  this->yz = a * this->yz;
  this->yx = a * this->yx;
  this->zx = a * this->zx;
  this->zy = a * this->zy;
  return this;
}

Assistant:

inline const Shear6<T> &
Shear6<T>::operator *= (T a)
{
    xy *= a;
    xz *= a;
    yz *= a;
    yx *= a;
    zx *= a;
    zy *= a;
    return *this;
}